

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidload.c
# Opt level: O2

FT_Error parse_fd_array(CID_Face face,CID_Parser *parser)

{
  FT_Memory memory;
  FT_Stream pFVar1;
  uint in_EAX;
  ulong uVar2;
  ulong new_count;
  CID_FaceDict pCVar3;
  FT_Error FVar4;
  ulong uVar5;
  undefined8 uStack_38;
  FT_Error error;
  
  memory = (face->root).memory;
  pFVar1 = parser->stream;
  uStack_38 = (ulong)in_EAX;
  uVar2 = (*(parser->root).funcs.to_int)(&parser->root);
  if ((long)uVar2 < 0) {
    FVar4 = 3;
  }
  else {
    new_count = pFVar1->size / 100;
    if (uVar2 < new_count) {
      new_count = uVar2;
    }
    FVar4 = 0;
    if ((face->cid).font_dicts == (CID_FaceDict)0x0) {
      uVar2 = 0;
      pCVar3 = (CID_FaceDict)
               ft_mem_realloc(memory,0x150,0,new_count,(void *)0x0,
                              (FT_Error *)((long)&uStack_38 + 4));
      (face->cid).font_dicts = pCVar3;
      FVar4 = uStack_38._4_4_;
      if (uStack_38._4_4_ == 0) {
        (face->cid).num_dicts = (int)new_count;
        uVar5 = new_count & 0xffffffff;
        if ((int)new_count < 1) {
          uVar5 = uVar2;
        }
        for (; uVar5 * 0x150 - uVar2 != 0; uVar2 = uVar2 + 0x150) {
          *(undefined4 *)((long)(pCVar3->private_dict).blue_values + (uVar2 - 8)) = 4;
        }
      }
    }
  }
  return FVar4;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  parse_fd_array( CID_Face     face,
                  CID_Parser*  parser )
  {
    CID_FaceInfo  cid    = &face->cid;
    FT_Memory     memory = face->root.memory;
    FT_Stream     stream = parser->stream;
    FT_Error      error  = FT_Err_Ok;
    FT_Long       num_dicts;


    num_dicts = cid_parser_to_int( parser );
    if ( num_dicts < 0 )
    {
      FT_ERROR(( "parse_fd_array: invalid number of dictionaries\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    /*
     * A single entry in the FDArray must (at least) contain the following
     * structure elements.
     *
     *   %ADOBeginFontDict              18
     *   X dict begin                   13
     *     /FontMatrix [X X X X]        22
     *     /Private X dict begin        22
     *     end                           4
     *   end                             4
     *   %ADOEndFontDict                16
     *
     * This needs 18+13+22+22+4+4+16=99 bytes or more.  Normally, you also
     * need a `dup X' at the very beginning and a `put' at the end, so a
     * rough guess using 100 bytes as the minimum is justified.
     */
    if ( (FT_ULong)num_dicts > stream->size / 100 )
    {
      FT_TRACE0(( "parse_fd_array: adjusting FDArray size"
                  " (from %d to %d)\n",
                  num_dicts,
                  stream->size / 100 ));
      num_dicts = (FT_Long)( stream->size / 100 );
    }

    if ( !cid->font_dicts )
    {
      FT_Int  n;


      if ( FT_NEW_ARRAY( cid->font_dicts, num_dicts ) )
        goto Exit;

      cid->num_dicts = num_dicts;

      /* don't forget to set a few defaults */
      for ( n = 0; n < cid->num_dicts; n++ )
      {
        CID_FaceDict  dict = cid->font_dicts + n;


        /* default value for lenIV */
        dict->private_dict.lenIV = 4;
      }
    }

  Exit:
    return error;
  }